

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Math.cpp
# Opt level: O3

void __thiscall BinaryOperator::~BinaryOperator(BinaryOperator *this)

{
  (this->super_Expression)._vptr_Expression = (_func_int **)&PTR___cxa_pure_virtual_00116ad0;
  this->left = (Expression *)0x0;
  this->right = (Expression *)0x0;
  return;
}

Assistant:

BinaryOperator::~BinaryOperator() {
  if (this->left == nullptr) {
    delete this->left;
  }
  this->left = nullptr;
  if (this->right == nullptr) {
    delete this->right;
  }
  this->right = nullptr;
}